

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LPO.cpp
# Opt level: O0

Result __thiscall Kernel::LPO::lpo(LPO *this,AppliedTerm tt1,AppliedTerm tt2)

{
  AppliedTerm s;
  AppliedTerm t;
  AppliedTerm other;
  AppliedTerm s_00;
  AppliedTerm s_01;
  AppliedTerm t_00;
  AppliedTerm t_01;
  bool bVar1;
  Result RVar2;
  Term *this_00;
  Term *this_01;
  TermList *in_RDI;
  TermList in_stack_00000008;
  TermList *pTStack0000000000000010;
  LPO *pLStack0000000000000018;
  TermList in_stack_00000020;
  TermList *in_stack_00000028;
  Term *in_stack_00000030;
  SubstApplicator *in_stack_00000038;
  Term *t2;
  Term *t1;
  TermList *this_02;
  Term *t2_00;
  Term *in_stack_fffffffffffffed0;
  PrecedenceOrdering *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  SubstApplicator *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff48;
  uint arity;
  TermList *in_stack_ffffffffffffff50;
  LPO *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  AppliedTerm *in_stack_ffffffffffffff80;
  TermList in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  SubstApplicator *in_stack_ffffffffffffff98;
  TermList *pTVar3;
  uint arity_00;
  Term *tl;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  arity = (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  other._8_8_ = in_stack_fffffffffffffee8;
  other.term._content = in_stack_fffffffffffffee0;
  other.applicator = in_stack_fffffffffffffef0;
  this_02 = in_stack_00000028;
  t2_00 = in_stack_00000030;
  pTVar3 = in_stack_00000028;
  tl = in_stack_00000030;
  bVar1 = AppliedTerm::equalsShallow((AppliedTerm *)in_stack_fffffffffffffed0,other);
  arity_00 = (uint)((ulong)pTVar3 >> 0x20);
  if (bVar1) {
    RVar2 = EQUAL;
  }
  else {
    bVar1 = TermList::isVar(this_02);
    if (bVar1) {
      bVar1 = TermList::operator==(&stack0x00000008,&stack0x00000020);
      RVar2 = INCOMPARABLE;
      if (bVar1) {
        RVar2 = EQUAL;
      }
    }
    else {
      bVar1 = TermList::isVar(this_02);
      if (bVar1) {
        bVar1 = AppliedTerm::containsVar(in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
        RVar2 = INCOMPARABLE;
        if (bVar1) {
          RVar2 = GREATER;
        }
      }
      else {
        this_00 = TermList::term((TermList *)0x8919af);
        this_01 = TermList::term((TermList *)0x8919c1);
        RVar2 = PrecedenceOrdering::comparePrecedences
                          (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,t2_00);
        if (RVar2 == GREATER) {
          Term::args(this_01);
          Term::arity(this_01);
          s_00._8_8_ = in_stack_00000008._content;
          s_00.term._content = (uint64_t)in_stack_00000030;
          s_00.applicator = (SubstApplicator *)pTStack0000000000000010;
          t_00._8_8_ = in_stack_ffffffffffffff90;
          t_00.term._content = (uint64_t)pLStack0000000000000018;
          t_00.applicator = in_stack_ffffffffffffff98;
          RVar2 = majo(in_stack_ffffffffffffff58,s_00,t_00,in_stack_ffffffffffffff50,arity);
        }
        else if (RVar2 == EQUAL) {
          Term::args(this_00);
          Term::args(this_01);
          Term::arity(this_00);
          s.applicator = (SubstApplicator *)in_stack_00000020._content;
          s._0_16_ = _pTStack0000000000000010;
          t._8_8_ = in_stack_00000030;
          t.term._content = (uint64_t)in_stack_00000028;
          t.applicator = in_stack_00000038;
          RVar2 = lexMAE((LPO *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),s,t,
                         in_RDI,(TermList *)tl,arity_00);
        }
        else {
          Term::args(this_00);
          Term::arity(this_00);
          s_01._8_8_ = in_stack_ffffffffffffff78;
          s_01.term._content = in_stack_ffffffffffffff70;
          s_01.applicator = (SubstApplicator *)in_stack_ffffffffffffff80;
          t_01._8_8_ = in_stack_ffffffffffffff90;
          t_01.term._content = in_stack_ffffffffffffff88._content;
          t_01.applicator = in_stack_ffffffffffffff98;
          RVar2 = alpha(pLStack0000000000000018,pTStack0000000000000010,
                        in_stack_00000008._content._4_4_,s_01,t_01);
        }
      }
    }
  }
  return RVar2;
}

Assistant:

Ordering::Result LPO::lpo(AppliedTerm tt1, AppliedTerm tt2) const
{
  if(tt1.equalsShallow(tt2)) {
    return EQUAL;
  }
  if (tt1.term.isVar()) {
    return (tt1.term==tt2.term) ? EQUAL : INCOMPARABLE;
  }

  if (tt2.term.isVar()) {
    return tt1.containsVar(tt2.term) ? GREATER : INCOMPARABLE;
  }

  auto t1=tt1.term.term();
  auto t2=tt2.term.term();

  switch (comparePrecedences(t1, t2)) {
  case EQUAL:
    return lexMAE(tt1, tt2, t1->args(), t2->args(), t1->arity());
  case GREATER:
    return majo(tt1, tt2, t2->args(), t2->arity());
  default:
    return alpha(t1->args(), t1->arity(), tt1, tt2);
  }
}